

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checking.cc
# Opt level: O0

bool __thiscall dtc::fdt::checking::checker::visit_node(checker *this,device_tree *tree,node_ptr *n)

{
  __shared_ptr_access<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Var1;
  node_ptr *pnVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  element_type *peVar6;
  element_type *peVar7;
  reference psVar8;
  reference n_00;
  __normal_iterator<std::shared_ptr<dtc::fdt::node>_*,_std::vector<std::shared_ptr<dtc::fdt::node>,_std::allocator<std::shared_ptr<dtc::fdt::node>_>_>_>
  local_a8;
  child_iterator e_1;
  child_iterator i_1;
  __normal_iterator<std::shared_ptr<dtc::fdt::property>_*,_std::vector<std::shared_ptr<dtc::fdt::property>,_std::allocator<std::shared_ptr<dtc::fdt::property>_>_>_>
  local_88;
  iterator e;
  iterator i;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  __shared_ptr_access<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *local_28;
  node_ptr *n_local;
  device_tree *tree_local;
  checker *this_local;
  
  local_28 = (__shared_ptr_access<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)n;
  n_local = (node_ptr *)tree;
  tree_local = (device_tree *)this;
  peVar6 = std::__shared_ptr_access<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)n);
  peVar7 = std::__shared_ptr_access<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->(local_28);
  std::make_pair<std::__cxx11::string&,std::__cxx11::string&>
            (&local_68,&peVar6->name,&peVar7->unit_address);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::push_back(&(this->path).
               super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ,&local_68);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair(&local_68);
  uVar4 = (*this->_vptr_checker[2])(this,n_local,local_28);
  if ((uVar4 & 1) == 0) {
    this_local._7_1_ = false;
  }
  else {
    peVar6 = std::__shared_ptr_access<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(local_28);
    e = node::property_begin(peVar6);
    peVar6 = std::__shared_ptr_access<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(local_28);
    local_88._M_current = (shared_ptr<dtc::fdt::property> *)node::property_end(peVar6);
    while (bVar3 = __gnu_cxx::operator!=(&e,&local_88), pnVar2 = n_local, p_Var1 = local_28, bVar3)
    {
      psVar8 = __gnu_cxx::
               __normal_iterator<std::shared_ptr<dtc::fdt::property>_*,_std::vector<std::shared_ptr<dtc::fdt::property>,_std::allocator<std::shared_ptr<dtc::fdt::property>_>_>_>
               ::operator*(&e);
      std::shared_ptr<dtc::fdt::property>::shared_ptr((shared_ptr<dtc::fdt::property> *)&i_1,psVar8)
      ;
      iVar5 = (*this->_vptr_checker[3])(this,pnVar2,p_Var1,(shared_ptr<dtc::fdt::property> *)&i_1);
      std::shared_ptr<dtc::fdt::property>::~shared_ptr((shared_ptr<dtc::fdt::property> *)&i_1);
      if ((((byte)iVar5 ^ 0xff) & 1) != 0) {
        return false;
      }
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<dtc::fdt::property>_*,_std::vector<std::shared_ptr<dtc::fdt::property>,_std::allocator<std::shared_ptr<dtc::fdt::property>_>_>_>
      ::operator++(&e);
    }
    peVar6 = std::__shared_ptr_access<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(local_28);
    e_1 = node::child_begin(peVar6);
    peVar6 = std::__shared_ptr_access<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(local_28);
    local_a8._M_current = (shared_ptr<dtc::fdt::node> *)node::child_end(peVar6);
    while (bVar3 = __gnu_cxx::operator!=(&e_1,&local_a8), pnVar2 = n_local, bVar3) {
      n_00 = __gnu_cxx::
             __normal_iterator<std::shared_ptr<dtc::fdt::node>_*,_std::vector<std::shared_ptr<dtc::fdt::node>,_std::allocator<std::shared_ptr<dtc::fdt::node>_>_>_>
             ::operator*(&e_1);
      bVar3 = visit_node(this,(device_tree *)pnVar2,n_00);
      if (!bVar3) {
        return false;
      }
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<dtc::fdt::node>_*,_std::vector<std::shared_ptr<dtc::fdt::node>,_std::allocator<std::shared_ptr<dtc::fdt::node>_>_>_>
      ::operator++(&e_1);
    }
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::pop_back(&(this->path).
                super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              );
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool
checker::visit_node(device_tree *tree, const node_ptr &n)
{
	path.push_back(std::make_pair(n->name, n->unit_address));
	// Check this node
	if (!check_node(tree, n))
	{
		return false;
	}
	// Now check its properties
	for (auto i=n->property_begin(), e=n->property_end() ; i!=e ; ++i)
	{
		if (!check_property(tree, n, *i))
		{
			return false;
		}
	}
	// And then recursively check the children
	for (node::child_iterator i=n->child_begin(), e=n->child_end() ; i!=e ;
	     ++i)
	{
		if (!visit_node(tree, *i))
		{
			return false;
		}
	}
	path.pop_back();
	return true;
}